

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O1

void __thiscall
baryonyx::itm::
solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
::solver_equalities_101coeff
          (solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  pointer pmVar1;
  pointer pfVar2;
  FILE *__stream;
  double *pdVar3;
  int *piVar4;
  ulong uVar5;
  rc_data *prVar6;
  bound_factor *__s;
  undefined8 extraout_RAX;
  pointer *ppfVar7;
  sparse_matrix<int> *this_00;
  long lVar8;
  pointer pfVar9;
  int *piVar10;
  ulong uVar11;
  string_view name;
  
  name._M_str = "solver_equalities_101coeff";
  name._M_len = 0x1a;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar11 = (ulong)(this->ap).m_rows_values.m_length;
  uVar5 = uVar11 * 8;
  pdVar3 = (double *)operator_new__(uVar5);
  memset(pdVar3,0,uVar5);
  (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar3;
  uVar11 = uVar11 << 2;
  piVar4 = (int *)operator_new__(uVar11);
  memset(piVar4,0,uVar11);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar4;
  pmVar1 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)*(pointer *)
                 ((long)&(pmVar1->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl + 8) -
          *(long *)&(pmVar1->elements).
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl >> 3;
  lVar8 = (long)(csts->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1;
  if (lVar8 != 0x28) {
    lVar8 = (lVar8 >> 3) * -0x3333333333333333 + -1;
    ppfVar7 = (pointer *)
              ((long)&pmVar1[1].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    do {
      uVar11 = (long)*ppfVar7 - (long)((_Vector_impl_data *)(ppfVar7 + -1))->_M_start >> 3;
      if (uVar5 <= uVar11) {
        uVar5 = uVar11;
      }
      ppfVar7 = ppfVar7 + 5;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  uVar5 = -(ulong)(uVar5 >> 0x3c != 0) | uVar5 << 4;
  prVar6 = (rc_data *)operator_new__(uVar5);
  memset(prVar6,0,uVar5);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
  ._M_head_impl = prVar6;
  uVar5 = 0xffffffffffffffff;
  if (-1 < m_) {
    uVar5 = (long)m_ << 3;
  }
  __s = (bound_factor *)operator_new__(uVar5);
  memset(__s,0,uVar5);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor_*,_false>
  ._M_head_impl = __s;
  pdVar3 = (double *)operator_new__(uVar5);
  this_00 = (sparse_matrix<int> *)0x0;
  memset(pdVar3,0,uVar5);
  (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar3;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  if (m_ != 0) {
    pmVar1 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      __s[uVar5].negative_factor = 0;
      __s[uVar5].value = pmVar1[uVar5].min;
      pfVar9 = *(pointer *)
                &pmVar1[uVar5].elements.
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl;
      pfVar2 = *(pointer *)
                ((long)&pmVar1[uVar5].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar9 != pfVar2) {
        piVar10 = piVar4 + (int)this_00;
        do {
          if ((pfVar9->factor + 1U & 0xfffffffd) != 0) {
            itm::solver_equalities_101coeff();
            goto LAB_002ddf99;
          }
          *piVar10 = pfVar9->factor;
          if (pfVar9->factor < 0) {
            __s[uVar5].negative_factor = __s[uVar5].negative_factor + 1;
          }
          pfVar9 = pfVar9 + 1;
          piVar10 = piVar10 + 1;
          this_00 = (sparse_matrix<int> *)(ulong)((int)this_00 + 1);
        } while (pfVar9 != pfVar2);
      }
      if (pmVar1[uVar5].min != pmVar1[uVar5].max) {
LAB_002ddf99:
        itm::solver_equalities_101coeff();
        operator_delete__(__s);
        (this->b)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor_*,_false>
        ._M_head_impl = (bound_factor *)0x0;
        prVar6 = (this->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                 ._M_head_impl;
        if (prVar6 != (rc_data *)0x0) {
          operator_delete__(prVar6);
        }
        (this->R)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
        ._M_head_impl = (rc_data *)0x0;
        piVar4 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if (piVar4 != (int *)0x0) {
          operator_delete__(piVar4);
        }
        (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
        pdVar3 = (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        if (pdVar3 != (double *)0x0) {
          operator_delete__(pdVar3);
        }
        (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
        sparse_matrix<int>::~sparse_matrix(this_00);
        __stream = (FILE *)(this->super_debug_logger<true>).ofs;
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
        }
        _Unwind_Resume(extraout_RAX);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)m_);
  }
  return;
}

Assistant:

solver_equalities_101coeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_equalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0; i != m; ++i) {
            b[i].negative_factor = 0;
            b[i].value = csts[i].min;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor < 0)
                    ++b[i].negative_factor;
            }

            bx_ensures(csts[i].min == csts[i].max);
        }
    }